

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O3

int absl::lts_20250127::GetStackFrames(void **result,int *sizes,int max_depth,int skip_count)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = UnwindImpl<true,false>;
  if (_ZN4absl12lts_2025012712_GLOBAL__N_16customE_0 != (code *)0x0) {
    pcVar2 = _ZN4absl12lts_2025012712_GLOBAL__N_16customE_0;
  }
  iVar1 = (*pcVar2)();
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE ABSL_ATTRIBUTE_NO_TAIL_CALL int GetStackFrames(
    void** result, int* sizes, int max_depth, int skip_count) {
  return Unwind<true, false>(result, sizes, max_depth, skip_count, nullptr,
                             nullptr);
}